

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_transaction.cpp
# Opt level: O2

void __thiscall
cpp_db::sqlite_transaction::sqlite_transaction
          (sqlite_transaction *this,shared_connection_ptr *conn_in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  db_exception *this_00;
  allocator<char> local_41;
  string local_40;
  
  (this->super_transaction_interface)._vptr_transaction_interface =
       (_func_int **)&PTR__sqlite_transaction_001929d0;
  std::__weak_ptr<cpp_db::connection_interface,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cpp_db::connection_interface,void>
            ((__weak_ptr<cpp_db::connection_interface,(__gnu_cxx::_Lock_policy)2> *)&this->conn,
             &conn_in->super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>)
  ;
  this->open_count = 0;
  p_Var1 = (this->conn).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var1->_M_use_count != 0)
     ) {
    return;
  }
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"No database connection!",&local_41);
  db_exception::db_exception(this_00,&local_40);
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sqlite_transaction::sqlite_transaction(const shared_connection_ptr &conn_in)
	: conn(conn_in)
    , open_count(0)
{
	if (conn.expired())
        throw db_exception("No database connection!");
}